

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicResourceTexture::RunIteration
          (BasicResourceTexture *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *pCVar1;
  GLuint *buffers;
  CallLogWrapper *this_00;
  bool bVar2;
  GLuint GVar3;
  GLint location;
  int depth;
  ostream *poVar4;
  Vector<float,_4> *v;
  bool *compile_error;
  int i;
  uint uVar5;
  bool bVar6;
  int width;
  int height;
  GLuint index;
  ulong uVar7;
  allocator_type local_239;
  CallLogWrapper *local_238;
  uvec3 global_size;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texture_data;
  Vector<float,_4> local_1e0;
  Vector<float,_4> local_1d0;
  ulong local_1c0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer_data;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  tcu::operator*((tcu *)&global_size,param_1,num_groups);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer_data);
  poVar4 = std::operator<<((ostream *)
                           &buffer_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "\nlayout(local_size_x = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", local_size_y = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", local_size_z = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,") in;\nconst uvec3 kGlobalSize = uvec3(");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,
                           ");\nuniform sampler2D g_sampler0;\nuniform lowp sampler3D g_sampler1;\nuniform mediump sampler2DArray g_sampler2;\nlayout(std430) buffer OutputBuffer {\n  vec4 data0["
                          );
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"];\n  vec4 data1[");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"];\n  vec4 data2[");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,
                  "];\n} g_out_buffer;\nvoid main() {\n  uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.data0[global_index] = texture(g_sampler0, vec2(gl_GlobalInvocationID) / vec2(kGlobalSize));\n  g_out_buffer.data1[global_index] = textureProj(g_sampler1, vec4(vec3(gl_GlobalInvocationID) / vec3(kGlobalSize), 1.0));\n  g_out_buffer.data2[global_index] = texelFetchOffset(g_sampler2, ivec3(gl_GlobalInvocationID), 0, ivec2(0));\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer_data);
  GVar3 = ComputeShaderBase::CreateComputeProgram
                    (&this->super_ComputeShaderBase,(string *)&texture_data);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&texture_data);
  pCVar1 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(pCVar1,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  bVar6 = false;
  if (bVar2) {
    local_238 = pCVar1;
    glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program);
    pCVar1 = local_238;
    for (uVar5 = 0; this_00 = local_238, uVar5 != 4; uVar5 = uVar5 + 1) {
      sprintf((char *)&buffer_data,"g_sampler%d",(ulong)uVar5);
      location = glu::CallLogWrapper::glGetUniformLocation
                           (pCVar1,this->m_program,(GLchar *)&buffer_data);
      glu::CallLogWrapper::glUniform1i(pCVar1,location,uVar5);
    }
    glu::CallLogWrapper::glUseProgram(local_238,0);
    width = num_groups->m_data[0] * param_1->m_data[0];
    height = num_groups->m_data[1] * param_1->m_data[1];
    depth = num_groups->m_data[2] * param_1->m_data[2];
    uVar5 = height * width * depth;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&buffer_data,(ulong)(uVar5 * 4),(allocator_type *)&texture_data);
    buffers = &this->m_storage_buffer;
    GVar3 = this->m_storage_buffer;
    if (GVar3 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
      GVar3 = *buffers;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar3);
    uVar7 = (ulong)uVar5;
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,uVar7 << 6,
               buffer_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&global_size,123.0);
    local_1c0 = uVar7;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&texture_data,uVar7,(Vector<float,_4> *)&global_size,&local_239);
    pCVar1 = local_238;
    if (this->m_texture[0] == 0) {
      glu::CallLogWrapper::glGenTextures(local_238,3,this->m_texture);
    }
    glu::CallLogWrapper::glActiveTexture(pCVar1,0x84c0);
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,this->m_texture[0]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (pCVar1,0xde1,0,0x8814,width,height,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(pCVar1,0x84c1);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x806f,this->m_texture[1]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x806f,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x806f,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (pCVar1,0x806f,0,0x8814,width,height,depth,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(pCVar1,0x84c2);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,this->m_texture[2]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (pCVar1,0x8c1a,0,0x8814,width,height,depth,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program);
    pCVar1 = local_238;
    if (dispatch_indirect) {
      GVar3 = this->m_dispatch_buffer;
      if (GVar3 == 0) {
        glu::CallLogWrapper::glGenBuffers(local_238,1,&this->m_dispatch_buffer);
        GVar3 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(pCVar1,0x90ee,GVar3);
      glu::CallLogWrapper::glBufferData(pCVar1,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(pCVar1,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (local_238,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,*buffers);
    glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x200);
    v = (Vector<float,_4> *)
        glu::CallLogWrapper::glMapBufferRange(pCVar1,0x90d2,0,local_1c0 * 0x30,1);
    bVar6 = true;
    for (uVar7 = 0; pCVar1 = local_238, uVar5 * 3 != uVar7; uVar7 = uVar7 + 1) {
      tcu::Vector<float,_4>::Vector(&local_1d0,v);
      tcu::Vector<float,_4>::Vector(&local_1e0,123.0);
      if ((local_1d0.m_data[0] != local_1e0.m_data[0]) ||
         (NAN(local_1d0.m_data[0]) || NAN(local_1e0.m_data[0]))) {
LAB_00c1d6d2:
        bVar6 = false;
        anon_unknown_0::Output("Incorrect data at index %d.\n",uVar7 & 0xffffffff);
      }
      else {
        if ((local_1d0.m_data[1] != local_1e0.m_data[1]) ||
           (NAN(local_1d0.m_data[1]) || NAN(local_1e0.m_data[1]))) goto LAB_00c1d6d2;
        if ((local_1d0.m_data[2] != local_1e0.m_data[2]) ||
           (NAN(local_1d0.m_data[2]) || NAN(local_1e0.m_data[2]))) goto LAB_00c1d6d2;
        if ((local_1d0.m_data[3] != local_1e0.m_data[3]) ||
           (NAN(local_1d0.m_data[3]) || NAN(local_1e0.m_data[3]))) goto LAB_00c1d6d2;
      }
      v = v + 1;
    }
    glu::CallLogWrapper::glUnmapBuffer(local_238,0x90d2);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,0);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&texture_data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&buffer_data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  return bVar6;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		glUseProgram(m_program);
		for (int i = 0; i < 4; ++i)
		{
			char name[32];
			sprintf(name, "g_sampler%d", i);
			glUniform1i(glGetUniformLocation(m_program, name), i);
		}
		glUseProgram(0);

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();
		const GLint kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());

		std::vector<vec4> buffer_data(kBufferSize * 4);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize * 4, &buffer_data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		std::vector<vec4> texture_data(kBufferSize, vec4(123.0f));
		if (m_texture[0] == 0)
			glGenTextures(3, m_texture);

		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_3D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE2);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture[2]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT,
					 &texture_data[0]);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		vec4* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		data = static_cast<vec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * 3 * kBufferSize, GL_MAP_READ_BIT));
		bool ret = true;
		for (GLuint index = 0; index < kBufferSize * 3; ++index)
		{
			if (!IsEqual(data[index], vec4(123.0f)))
			{
				Output("Incorrect data at index %d.\n", index);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return ret;
	}